

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
TwoValuesWithHashCollision_LeafLevelLinearUpsertIterator_Test::
TwoValuesWithHashCollision_LeafLevelLinearUpsertIterator_Test
          (TwoValuesWithHashCollision_LeafLevelLinearUpsertIterator_Test *this)

{
  TwoValuesWithHashCollision_LeafLevelLinearUpsertIterator_Test *this_local;
  
  anon_unknown.dwarf_10ddcf::TwoValuesWithHashCollision::TwoValuesWithHashCollision
            (&this->super_TwoValuesWithHashCollision);
  (this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)
               &PTR__TwoValuesWithHashCollision_LeafLevelLinearUpsertIterator_Test_003d0cb8;
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelLinearUpsertIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "g");
    {
        std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "h");
        EXPECT_TRUE (itp.second);
        EXPECT_EQ ((*itp.first).first, "h"s);
    }
    this->insert_or_assign (*index_, t1, "i");

    // Check trie iterator in the heap.
    test_trie::const_iterator first = index_->find (db_, "h"s);
    test_trie::const_iterator last = index_->end (db_);
    EXPECT_NE (first, last);
    std::string const & v1 = (*first).first;
    EXPECT_EQ ("h", v1);
    ++first;
    std::string const & v2 = (*first).first;
    EXPECT_EQ ("i", v2);
    ++first;
    EXPECT_EQ (first, last);

    index_->flush (t1, db_.get_current_revision ());

    std::pair<test_trie::iterator, bool> itp =
        this->insert_or_assign (*index_, t1, "g", "new value g");
    EXPECT_FALSE (itp.second);
    // Check trie iterator in the store.
    first = itp.first;
    EXPECT_NE (first, last);
    std::string const v4 = first->first;
    EXPECT_EQ ("g", v4);
    ++first;
    std::string const v5 = first->first;
    EXPECT_EQ ("h", v5);
    ++first;
    std::string const v6 = first->first;
    EXPECT_EQ ("i", v6);
    ++first;
    EXPECT_EQ (first, last);

    // Check assigned new value.
    std::string const & v7 = (*itp.first).second;
    EXPECT_EQ ("new value g", v7);
}